

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O2

char * rapidjson::internal::dtoa(double value,char *buffer)

{
  char *pcVar1;
  int K;
  int length;
  int local_20;
  int local_1c;
  
  if ((value != 0.0) || (NAN(value))) {
    if (value < 0.0) {
      *buffer = '-';
      buffer = buffer + 1;
      value = -value;
    }
    Grisu2(value,buffer,&local_1c,&local_20);
    pcVar1 = Prettify(buffer,local_1c,local_20);
  }
  else {
    if ((long)value < 0) {
      *buffer = '-';
      buffer = buffer + 1;
    }
    buffer[0] = '0';
    buffer[1] = '.';
    buffer[2] = '0';
    pcVar1 = buffer + 3;
  }
  return pcVar1;
}

Assistant:

inline char* dtoa(double value, char* buffer) {
    Double d(value);
    if (d.IsZero()) {
        if (d.Sign())
            *buffer++ = '-';     // -0.0, Issue #289
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else {
        if (value < 0) {
            *buffer++ = '-';
            value = -value;
        }
        int length, K;
        Grisu2(value, buffer, &length, &K);
        return Prettify(buffer, length, K);
    }
}